

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

namespace_t * cs_impl::get_ext<cs::pointer>(void)

{
  runtime_error *this;
  string *str;
  char *in_stack_000003a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined1 local_61 [97];
  
  this = (runtime_error *)__cxa_allocate_exception(0x28);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_61 + 1),"Target type \"",(allocator *)__lhs);
  str = (string *)get_name_of_type<cs::pointer>();
  cxx_demangle_abi_cxx11_(in_stack_000003a8);
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::operator+(__lhs,(char *)this);
  cs::runtime_error::runtime_error(this,str);
  __cxa_throw(this,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

static cs::namespace_t &get_ext()
	{
		throw cs::runtime_error(std::string("Target type \"") + cs_impl::cxx_demangle(cs_impl::get_name_of_type<T>()) +
		                        "\" doesn't have extension field.");
	}